

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  string *__lhs;
  RE *a_regex;
  char *in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  int in_R8D;
  undefined8 *in_R9;
  int death_test_index;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  undefined8 in_stack_fffffffffffffe70;
  int line_00;
  char *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined4 local_124;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_4c;
  InternalRunDeathTestFlag *local_48;
  UnitTestImpl *local_40;
  undefined8 *local_38;
  int local_2c;
  char *local_28;
  
  line_00 = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_40 = GetUnitTestImpl();
  local_48 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)0x1c32b1);
  UnitTestImpl::current_test_info(local_40);
  iVar2 = TestInfo::increment_death_test_count((TestInfo *)0x1c32ce);
  local_4c = iVar2;
  if (local_48 != (InternalRunDeathTestFlag *)0x0) {
    pcVar4 = InternalRunDeathTestFlag::index(local_48,in_RSI,__c);
    if ((int)pcVar4 < iVar2) {
      pbVar5 = &local_f0;
      StreamableToString<int>(in_stack_fffffffffffffe98);
      std::operator+(&local_d0,"Death test count (",pbVar5);
      pbVar5 = &local_d0;
      std::operator+(&local_b0,pbVar5,") somehow exceeded expected maximum (");
      pcVar4 = InternalRunDeathTestFlag::index(local_48,(char *)pbVar5,__c_00);
      local_124 = SUB84(pcVar4,0);
      StreamableToString<int>(in_stack_fffffffffffffe98);
      std::operator+(&local_90,&local_b0,&local_120);
      std::operator+(&local_70,&local_90,")");
      DeathTest::set_last_death_test_message((string *)0x1c33d0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      return false;
    }
    __lhs = InternalRunDeathTestFlag::file_abi_cxx11_(local_48);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,local_28);
    if (((!bVar1) || (iVar3 = InternalRunDeathTestFlag::line(local_48), iVar3 != local_2c)) ||
       (pcVar4 = InternalRunDeathTestFlag::index(local_48,local_28,__c_01),
       in_stack_fffffffffffffe94 = iVar2, (int)pcVar4 != local_4c)) {
      *local_38 = 0;
      return true;
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  if (bVar1) {
    pcVar4 = (char *)operator_new(0x40);
    ExecDeathTest::ExecDeathTest
              ((ExecDeathTest *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,
               (RE *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),pcVar4,line_00);
    *local_38 = pcVar4;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            FLAGS_gtest_death_test_style_abi_cxx11_,"fast");
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffe98,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      std::operator+(&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffe98,"\" encountered");
      DeathTest::set_last_death_test_message((string *)0x1c36c0);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
      return false;
    }
    a_regex = (RE *)operator_new(0x30);
    NoExecDeathTest::NoExecDeathTest
              ((NoExecDeathTest *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,a_regex);
    *local_38 = a_regex;
  }
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# elif GTEST_OS_FUCHSIA

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }